

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void cmQtAutoGenerator::ReadOnlyProcessT::UVExit
               (uv_process_t *handle,int64_t exitStatus,int termSignal)

{
  int iVar1;
  int64_t iVar2;
  bool bVar3;
  ProcessResultT *pPVar4;
  string local_78;
  string local_48;
  ReadOnlyProcessT *local_28;
  ReadOnlyProcessT *proc;
  int64_t iStack_18;
  int termSignal_local;
  int64_t exitStatus_local;
  uv_process_t *handle_local;
  
  local_28 = (ReadOnlyProcessT *)handle->data;
  proc._4_4_ = termSignal;
  iStack_18 = exitStatus;
  exitStatus_local = (int64_t)handle;
  bVar3 = IsStarted(local_28);
  if ((bVar3) && (bVar3 = IsFinished(local_28), iVar2 = iStack_18, !bVar3)) {
    pPVar4 = Result(local_28);
    iVar1 = proc._4_4_;
    pPVar4->ExitStatus = iVar2;
    pPVar4 = Result(local_28);
    pPVar4->TermSignal = iVar1;
    pPVar4 = Result(local_28);
    bVar3 = ProcessResultT::error(pPVar4);
    if (!bVar3) {
      if (proc._4_4_ == 0) {
        if (iStack_18 != 0) {
          pPVar4 = Result(local_28);
          std::__cxx11::string::operator=
                    ((string *)&pPVar4->ErrorMessage,"Process failed with return value ");
          pPVar4 = Result(local_28);
          std::__cxx11::to_string(&local_78,pPVar4->ExitStatus);
          pPVar4 = Result(local_28);
          std::__cxx11::string::operator+=((string *)&pPVar4->ErrorMessage,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
      }
      else {
        pPVar4 = Result(local_28);
        std::__cxx11::string::operator=
                  ((string *)&pPVar4->ErrorMessage,"Process was terminated by signal ");
        pPVar4 = Result(local_28);
        std::__cxx11::to_string(&local_48,pPVar4->TermSignal);
        pPVar4 = Result(local_28);
        std::__cxx11::string::operator+=((string *)&pPVar4->ErrorMessage,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
      }
    }
    ::cm::uv_handle_ptr_base_<uv_process_s>::reset
              ((uv_handle_ptr_base_<uv_process_s> *)&local_28->UVProcess_);
    UVTryFinish(local_28);
  }
  return;
}

Assistant:

void cmQtAutoGenerator::ReadOnlyProcessT::UVExit(uv_process_t* handle,
                                                 int64_t exitStatus,
                                                 int termSignal)
{
  auto& proc = *reinterpret_cast<ReadOnlyProcessT*>(handle->data);
  if (proc.IsStarted() && !proc.IsFinished()) {
    // Set error message on demand
    proc.Result()->ExitStatus = exitStatus;
    proc.Result()->TermSignal = termSignal;
    if (!proc.Result()->error()) {
      if (termSignal != 0) {
        proc.Result()->ErrorMessage = "Process was terminated by signal ";
        proc.Result()->ErrorMessage +=
          std::to_string(proc.Result()->TermSignal);
      } else if (exitStatus != 0) {
        proc.Result()->ErrorMessage = "Process failed with return value ";
        proc.Result()->ErrorMessage +=
          std::to_string(proc.Result()->ExitStatus);
      }
    }

    // Reset process handle and try to finish
    proc.UVProcess_.reset();
    proc.UVTryFinish();
  }
}